

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O0

String * Tigre::operator+(String *__return_storage_ptr__,string *lhs,string *rhs)

{
  string local_40;
  string *local_20;
  string *rhs_local;
  string *lhs_local;
  
  local_20 = rhs;
  rhs_local = lhs;
  lhs_local = &__return_storage_ptr__->value;
  std::__cxx11::string::operator+=((string *)lhs,(string *)rhs);
  std::__cxx11::string::string((string *)&local_40,(string *)lhs);
  String::String(__return_storage_ptr__,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

Tigre::String Tigre::operator+(std::string lhs, const std::string& rhs){
    lhs += rhs;
    return lhs;
}